

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTime.cpp
# Opt level: O0

string * __thiscall DateTime::getTimestamp_abi_cxx11_(string *__return_storage_ptr__,DateTime *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  undefined1 local_248 [8];
  string mer;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string str;
  DateTime *this_local;
  
  str.field_2._8_8_ = this;
  std::__cxx11::to_string(&local_178,this->date);
  std::operator+(&local_158,&local_178,"/");
  std::__cxx11::to_string(&local_1a8,this->month);
  std::operator+(&local_138,&local_158,&local_1a8);
  std::operator+(&local_118,&local_138,"/");
  std::__cxx11::to_string(&local_1c8,this->year);
  std::operator+(&local_f8,&local_118,&local_1c8);
  std::operator+(&local_d8,&local_f8," ");
  std::__cxx11::to_string(&local_1e8,this->hour);
  std::operator+(&local_b8,&local_d8,&local_1e8);
  std::operator+(&local_98,&local_b8,":");
  std::__cxx11::to_string(&local_208,this->minute);
  std::operator+(&local_78,&local_98,&local_208);
  std::operator+(&local_58,&local_78,":");
  std::__cxx11::to_string((string *)((long)&mer.field_2 + 8),this->second);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&mer.field_2 + 8));
  std::__cxx11::string::~string((string *)(mer.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::string((string *)local_248);
  if (this->meridy == 'A') {
    std::__cxx11::string::operator=((string *)local_248,"AM");
  }
  else {
    std::__cxx11::string::operator=((string *)local_248,"PM");
  }
  std::operator+(&local_268,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38," ");
  std::operator+(__return_storage_ptr__,&local_268,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)local_248);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

string DateTime::getTimestamp() const {
    string str = to_string(date) + "/" + to_string(month) + "/" + to_string(year) + " " + to_string(hour) + ":" +
                 to_string(minute) + ":" + to_string(second);
    string mer;
    if (meridy == 'A') mer = "AM";
    else mer = "PM";
    return str + " " + mer;
}